

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaSSModel.cpp
# Opt level: O0

void __thiscall NaStateSpaceModel::NaStateSpaceModel(NaStateSpaceModel *this)

{
  NaReal *pNVar1;
  undefined8 *in_RDI;
  uint in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff8c;
  NaConfigPart *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  NaUnit *in_stack_ffffffffffffffa0;
  
  NaUnit::NaUnit(in_stack_ffffffffffffffa0,(uint)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                 (uint)in_stack_ffffffffffffff98,(uint)((ulong)in_stack_ffffffffffffff90 >> 0x20));
  NaConfigPart::NaConfigPart
            (in_stack_ffffffffffffff90,
             (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  *in_RDI = &PTR_PrintLog_00198598;
  in_RDI[4] = &PTR__NaStateSpaceModel_00198688;
  *(undefined4 *)(in_RDI + 8) = 1;
  *(undefined4 *)((long)in_RDI + 0x44) = 1;
  *(undefined4 *)(in_RDI + 9) = 1;
  NaMatrix::NaMatrix((NaMatrix *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                     in_stack_ffffffffffffff88);
  NaMatrix::NaMatrix((NaMatrix *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                     in_stack_ffffffffffffff88);
  NaMatrix::NaMatrix((NaMatrix *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                     in_stack_ffffffffffffff88);
  NaMatrix::NaMatrix((NaMatrix *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                     in_stack_ffffffffffffff88);
  NaVector::NaVector((NaVector *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  NaVector::NaVector((NaVector *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  pNVar1 = NaMatrix::fetch((NaMatrix *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                           in_stack_ffffffffffffff88);
  *pNVar1 = 0.0;
  pNVar1 = NaMatrix::fetch((NaMatrix *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                           in_stack_ffffffffffffff88);
  *pNVar1 = 0.0;
  pNVar1 = NaMatrix::fetch((NaMatrix *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                           in_stack_ffffffffffffff88);
  *pNVar1 = 0.0;
  pNVar1 = NaMatrix::fetch((NaMatrix *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                           in_stack_ffffffffffffff88);
  *pNVar1 = 0.0;
  return;
}

Assistant:

NaStateSpaceModel::NaStateSpaceModel ()
    : NaUnit(1, 1),
      A(1, 1), B(1, 1), C(1, 1), D(1, 1), x(1), x0(0),
      n(1), m(1), k(1),
      NaConfigPart(NaTYPE_StateSpaceModel)
{
    A.fetch(0,0) = 0.0;
    B.fetch(0,0) = 0.0;
    C.fetch(0,0) = 0.0;
    D.fetch(0,0) = 0.0;
}